

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialEnergyObjectiveFunction.cpp
# Opt level: O3

void __thiscall
OpenMD::PotentialEnergyObjectiveFunction::gradient
          (PotentialEnergyObjectiveFunction *this,
          DynamicVector<double,_std::allocator<double>_> *grad,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  setCoor(this,x);
  Shake::constraintR(this->shake_);
  (*this->forceMan_->_vptr_ForceManager[2])();
  if (this->hasFlucQ_ == true) {
    FluctuatingChargeConstraints::applyConstraints(this->fqConstraints_);
  }
  Shake::constraintF(this->shake_);
  getGrad(this,grad);
  return;
}

Assistant:

void PotentialEnergyObjectiveFunction::gradient(
      DynamicVector<RealType>& grad, const DynamicVector<RealType>& x) {
    setCoor(x);
    shake_->constraintR();
    forceMan_->calcForces();
    if (hasFlucQ_) fqConstraints_->applyConstraints();
    shake_->constraintF();
    getGrad(grad);
  }